

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MissingPropertyTypeHandler.cpp
# Opt level: O2

DynamicTypeHandler * __thiscall
Js::MissingPropertyTypeHandler::Clone(MissingPropertyTypeHandler *this,Recycler *recycler)

{
  Recycler *alloc;
  DynamicTypeHandler *this_00;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9a4c2aa;
  data.filename._0_4_ = 0x14;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_38);
  this_00 = (DynamicTypeHandler *)new<Memory::Recycler>(0x18,alloc,0x37a1d4);
  MissingPropertyTypeHandler((MissingPropertyTypeHandler *)this_00);
  return this_00;
}

Assistant:

DynamicTypeHandler * MissingPropertyTypeHandler::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, MissingPropertyTypeHandler);
    }